

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

void __thiscall dg::vr::ValueRelations::areMerged(ValueRelations *this,Handle to,Handle from)

{
  BucketToVals *this_00;
  iterator iVar1;
  iterator iVar2;
  Handle pBVar3;
  VectorSet<const_llvm::Value_*> fromVals;
  key_type local_50;
  _Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> local_48;
  
  this_00 = &this->bucketToVals;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)to;
  iVar1 = std::
          _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
          ::find(&this_00->_M_t,(key_type *)&local_48);
  local_50._M_data = from;
  iVar2 = std::
          _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
          ::find(&this_00->_M_t,&local_50);
  std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::vector
            ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)&local_48,
             (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
             &iVar2._M_node[1]._M_parent);
  for (pBVar3 = (Handle)local_48._M_impl.super__Vector_impl_data._M_start;
      pBVar3 != (Handle)local_48._M_impl.super__Vector_impl_data._M_finish;
      pBVar3 = (Handle)&pBVar3->relatedBuckets) {
    add(this,(V)pBVar3->id,to,(VectorSet<const_llvm::Value_*> *)&iVar1._M_node[1]._M_parent);
  }
  local_50._M_data = from;
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  ::erase(&this_00->_M_t,&local_50);
  std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void ValueRelations::areMerged(Handle to, Handle from) {
    VectorSet<V> &toVals = bucketToVals.find(to)->second;
    assert(bucketToVals.find(from) != bucketToVals.end());
    const VectorSet<V> fromVals = bucketToVals.find(from)->second;

    for (V val : fromVals)
        add(val, to, toVals);

    assert(bucketToVals.at(from).empty());
    bucketToVals.erase(from);
}